

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PoleFilter.cpp
# Opt level: O0

void __thiscall
Iir::HighPassTransform::HighPassTransform
          (HighPassTransform *this,double fc,LayoutBase *digital,LayoutBase *analog)

{
  complex_t c;
  complex_t c_00;
  complex_t c_01;
  uint uVar1;
  PoleZeroPair *pPVar2;
  LayoutBase *in_RDX;
  LayoutBase *in_RSI;
  double *in_RDI;
  double in_XMM0_Qa;
  double dVar3;
  complex_t *extraout_XMM0_Qa;
  double g;
  LayoutBase *this_00;
  PoleZeroPair *pair_1;
  PoleZeroPair *pair;
  int i;
  int pairs;
  int numPoles;
  undefined8 in_stack_ffffffffffffff18;
  int pairIndex;
  LayoutBase *in_stack_ffffffffffffff20;
  char *in_stack_ffffffffffffff30;
  HighPassTransform *in_stack_ffffffffffffff80;
  complex_t *in_stack_ffffffffffffff88;
  LayoutBase *in_stack_ffffffffffffff90;
  LayoutBase *zero;
  complex_t *pole;
  int local_2c;
  
  *in_RDI = 0.0;
  if (0.5 <= in_XMM0_Qa) {
    throw_invalid_argument(in_stack_ffffffffffffff30);
  }
  if (in_XMM0_Qa < 0.0) {
    throw_invalid_argument(in_stack_ffffffffffffff30);
  }
  LayoutBase::reset(in_RSI);
  dVar3 = tan(in_XMM0_Qa * 3.141592653589793);
  *in_RDI = 1.0 / dVar3;
  uVar1 = LayoutBase::getNumPoles(in_RDX);
  for (local_2c = 0; pairIndex = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20),
      local_2c < (int)uVar1 / 2; local_2c = local_2c + 1) {
    pPVar2 = LayoutBase::operator[](in_stack_ffffffffffffff20,pairIndex);
    this_00 = *(LayoutBase **)((pPVar2->poles).super_complex_pair_t.first._M_value + 8);
    c._M_value._8_8_ = in_stack_ffffffffffffff90;
    c._M_value._0_8_ = in_stack_ffffffffffffff88;
    zero = this_00;
    transform(in_stack_ffffffffffffff80,c);
    in_stack_ffffffffffffff88 = *(complex_t **)(pPVar2->zeros).super_complex_pair_t.first._M_value;
    in_stack_ffffffffffffff90 =
         *(LayoutBase **)((pPVar2->zeros).super_complex_pair_t.first._M_value + 8);
    pole = extraout_XMM0_Qa;
    transform(in_stack_ffffffffffffff80,
              (complex_t)*&(pPVar2->zeros).super_complex_pair_t.first._M_value);
    LayoutBase::addPoleZeroConjugatePairs(this_00,pole,(complex_t *)zero);
  }
  if ((uVar1 & 1) != 0) {
    pPVar2 = LayoutBase::operator[](in_stack_ffffffffffffff20,pairIndex);
    c_00._M_value._8_8_ = in_stack_ffffffffffffff90;
    c_00._M_value._0_8_ = in_stack_ffffffffffffff88;
    transform((HighPassTransform *)pPVar2,c_00);
    c_01._M_value._8_8_ = in_stack_ffffffffffffff90;
    c_01._M_value._0_8_ = in_stack_ffffffffffffff88;
    transform((HighPassTransform *)pPVar2,c_01);
    LayoutBase::add(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(complex_t *)pPVar2);
  }
  dVar3 = LayoutBase::getNormalW(in_RDX);
  dVar3 = 3.141592653589793 - dVar3;
  g = LayoutBase::getNormalGain(in_RDX);
  LayoutBase::setNormal(in_RSI,dVar3,g);
  return;
}

Assistant:

HighPassTransform::HighPassTransform (double fc,
                                      LayoutBase& digital,
                                      LayoutBase const& analog)
{
	if (!(fc < 0.5)) throw_invalid_argument(cutoffError);
	if (fc < 0.0) throw_invalid_argument(cutoffNeg);
	
	digital.reset ();
	
	// prewarp
	f = 1. / tan (doublePi * fc);
	
	const int numPoles = analog.getNumPoles ();
	const int pairs = numPoles / 2;
	for (int i = 0; i < pairs; ++i)
	{
		const PoleZeroPair& pair = analog[i];
		digital.addPoleZeroConjugatePairs (transform (pair.poles.first),
						   transform (pair.zeros.first));
	}
	
	if (numPoles & 1)
	{
		const PoleZeroPair& pair = analog[pairs];
		digital.add (transform (pair.poles.first),
			     transform (pair.zeros.first));
	}
	
	digital.setNormal (doublePi - analog.getNormalW(),
			   analog.getNormalGain());
}